

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O0

void mdef_sseq2sen_active(mdef_t *mdef,uint8 *sseq,uint8 *sen)

{
  s3senid_t *psVar1;
  s3senid_t *sp;
  int32 i;
  int32 ss;
  uint8 *sen_local;
  uint8 *sseq_local;
  mdef_t *mdef_local;
  
  for (sp._4_4_ = 0; sp._4_4_ < mdef->n_sseq; sp._4_4_ = sp._4_4_ + 1) {
    if (sseq[sp._4_4_] != '\0') {
      psVar1 = mdef->sseq[sp._4_4_];
      for (sp._0_4_ = 0; (int)sp < mdef->n_emit_state; sp._0_4_ = (int)sp + 1) {
        sen[psVar1[(int)sp]] = '\x01';
      }
    }
  }
  return;
}

Assistant:

void
mdef_sseq2sen_active(mdef_t * mdef, uint8 * sseq, uint8 * sen)
{
    int32 ss, i;
    s3senid_t *sp;

    for (ss = 0; ss < mdef_n_sseq(mdef); ss++) {
        if (sseq[ss]) {
            sp = mdef->sseq[ss];
            for (i = 0; i < mdef_n_emit_state(mdef); i++)
                sen[sp[i]] = 1;
        }
    }
}